

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp.cpp
# Opt level: O0

lzham_compress_status_t
lzham::create_internal_init_params(init_params *internal_params,lzham_compress_params *pParams)

{
  uint uVar1;
  uint uVar2;
  long in_RSI;
  long in_RDI;
  uint rate;
  undefined4 local_20;
  uint local_1c;
  lzham_compress_status_t local_4;
  
  if ((*(uint *)(in_RSI + 4) < 0xf) || (0x1d < *(uint *)(in_RSI + 4))) {
    local_4 = LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  else if (*(uint *)(in_RSI + 0x30) < 9) {
    if (*(uint *)(in_RSI + 0x30) < 2) {
      *(undefined4 *)(in_RDI + 0x34) = 4;
    }
    else {
      *(undefined4 *)(in_RDI + 0x34) = *(undefined4 *)(in_RSI + 0x30);
    }
    if (*(int *)(in_RSI + 0x34) != 0) {
      uVar1 = math::clamp<unsigned_int>(*(uint *)(in_RSI + 0x34),8,0x102);
      *(uint *)(in_RDI + 0x38) = uVar1;
    }
    *(undefined4 *)(in_RDI + 0x10) = *(undefined4 *)(in_RSI + 4);
    if (*(int *)(in_RSI + 0x10) < 0) {
      uVar2 = lzham_get_max_helper_threads();
      *(uint *)(in_RDI + 8) = uVar2;
    }
    else {
      *(undefined4 *)(in_RDI + 8) = *(undefined4 *)(in_RSI + 0x10);
    }
    if (*(uint *)(in_RDI + 8) < 0x41) {
      local_20 = *(undefined4 *)(in_RDI + 8);
    }
    else {
      local_20 = 0x40;
    }
    *(undefined4 *)(in_RDI + 8) = local_20;
    *(undefined4 *)(in_RDI + 0x18) = *(undefined4 *)(in_RSI + 0x14);
    if (*(int *)(in_RSI + 0x18) != 0) {
      if ((*(long *)(in_RSI + 0x20) == 0) ||
         ((uint)(1 << ((byte)*(undefined4 *)(in_RSI + 4) & 0x1f)) < *(uint *)(in_RSI + 0x18))) {
        return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      }
      *(undefined4 *)(in_RDI + 0x28) = *(undefined4 *)(in_RSI + 0x18);
      *(undefined8 *)(in_RDI + 0x20) = *(undefined8 *)(in_RSI + 0x20);
    }
    switch(*(undefined4 *)(in_RSI + 8)) {
    case 0:
      *(undefined4 *)(in_RDI + 0xc) = 0;
      break;
    case 1:
      *(undefined4 *)(in_RDI + 0xc) = 1;
      break;
    case 2:
      *(undefined4 *)(in_RDI + 0xc) = 2;
      break;
    case 3:
      *(undefined4 *)(in_RDI + 0xc) = 3;
      break;
    case 4:
      *(undefined4 *)(in_RDI + 0xc) = 4;
      break;
    default:
      return LZHAM_COMP_STATUS_INVALID_PARAMETER;
    }
    if ((*(int *)(in_RSI + 0x28) == 0) && (*(int *)(in_RSI + 0x2c) == 0)) {
      local_1c = *(uint *)(in_RSI + 0xc);
      if (local_1c == 0) {
        local_1c = 8;
      }
      uVar1 = math::clamp<unsigned_int>(local_1c,1,0x14);
      *(uint *)(in_RDI + 0x2c) =
           (uint)*(ushort *)((long)&g_table_update_settings + (ulong)(uVar1 - 1) * 4);
      *(uint *)(in_RDI + 0x30) =
           (uint)*(ushort *)((long)&g_table_update_settings + (ulong)(uVar1 - 1) * 4 + 2);
    }
    else {
      *(undefined4 *)(in_RDI + 0x2c) = *(undefined4 *)(in_RSI + 0x28);
      *(undefined4 *)(in_RDI + 0x30) = *(undefined4 *)(in_RSI + 0x2c);
    }
    local_4 = LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE;
  }
  else {
    local_4 = LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  return local_4;
}

Assistant:

static lzham_compress_status_t create_internal_init_params(lzcompressor::init_params &internal_params, const lzham_compress_params *pParams)
   {
      if ((pParams->m_dict_size_log2 < CLZBase::cMinDictSizeLog2) || (pParams->m_dict_size_log2 > CLZBase::cMaxDictSizeLog2))
      {
         LZHAM_LOG_ERROR(6000);
         return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      }
      
      if (pParams->m_extreme_parsing_max_best_arrivals > cMaxParseNodeStates)
      {
         LZHAM_LOG_ERROR(6001);
         return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      }
      
      if (pParams->m_extreme_parsing_max_best_arrivals <= 1)
         internal_params.m_extreme_parsing_max_best_arrivals = cDefaultMaxParseNodeStates;
      else
         internal_params.m_extreme_parsing_max_best_arrivals = pParams->m_extreme_parsing_max_best_arrivals;			     

      if (pParams->m_fast_bytes > 0)
         internal_params.m_fast_bytes_override = math::clamp<uint>(pParams->m_fast_bytes, LZHAM_MIN_FAST_BYTES, LZHAM_MAX_FAST_BYTES);

      internal_params.m_dict_size_log2 = pParams->m_dict_size_log2;
      
      if (pParams->m_max_helper_threads < 0)
         internal_params.m_max_helper_threads = lzham_get_max_helper_threads();
      else
         internal_params.m_max_helper_threads = pParams->m_max_helper_threads;
      internal_params.m_max_helper_threads = LZHAM_MIN(LZHAM_MAX_HELPER_THREADS, internal_params.m_max_helper_threads);

      internal_params.m_lzham_compress_flags = pParams->m_compress_flags;

      if (pParams->m_num_seed_bytes)
      {
         if ((!pParams->m_pSeed_bytes) || (pParams->m_num_seed_bytes > (1U << pParams->m_dict_size_log2)))
         {
            LZHAM_LOG_ERROR(6002);
            return LZHAM_COMP_STATUS_INVALID_PARAMETER;
         }

         internal_params.m_num_seed_bytes = pParams->m_num_seed_bytes;
         internal_params.m_pSeed_bytes = pParams->m_pSeed_bytes;
      }

      switch (pParams->m_level)
      {
         case LZHAM_COMP_LEVEL_FASTEST:   internal_params.m_compression_level = cCompressionLevelFastest; break;
         case LZHAM_COMP_LEVEL_FASTER:    internal_params.m_compression_level = cCompressionLevelFaster; break;
         case LZHAM_COMP_LEVEL_DEFAULT:   internal_params.m_compression_level = cCompressionLevelDefault; break;
         case LZHAM_COMP_LEVEL_BETTER:    internal_params.m_compression_level = cCompressionLevelBetter; break;
         case LZHAM_COMP_LEVEL_UBER:      internal_params.m_compression_level = cCompressionLevelUber; break;
         default:
            LZHAM_LOG_ERROR(6003);
            return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      };

		if (pParams->m_table_max_update_interval || pParams->m_table_update_interval_slow_rate)
		{
			internal_params.m_table_max_update_interval = pParams->m_table_max_update_interval;
			internal_params.m_table_update_interval_slow_rate = pParams->m_table_update_interval_slow_rate;
		}
		else 
		{
			uint rate = pParams->m_table_update_rate;
			if (!rate)
				rate = LZHAM_DEFAULT_TABLE_UPDATE_RATE;
			rate = math::clamp<uint>(rate, 1, LZHAM_FASTEST_TABLE_UPDATE_RATE) - 1;
			internal_params.m_table_max_update_interval = g_table_update_settings[rate].m_max_update_interval;
			internal_params.m_table_update_interval_slow_rate = g_table_update_settings[rate].m_slow_rate;
		}

      return LZHAM_COMP_STATUS_SUCCESS;
   }